

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O2

BOOL Js::JavascriptConversion::ToBoolean_Full(Var aValue,ScriptContext *scriptContext)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  charcount_t cVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  JavascriptTypedNumber<unsigned_long> *pJVar8;
  JavascriptString *this;
  
  bVar3 = TaggedInt::Is(aValue);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                ,0x2ec,"(!TaggedInt::Is(aValue))","Should be detected");
    if (!bVar3) goto LAB_0098498d;
    *puVar6 = 0;
  }
  bVar3 = VarIs<Js::RecyclableObject>(aValue);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                ,0x2ed,"(VarIs<RecyclableObject>(aValue))",
                                "Should be handled already");
    if (!bVar3) goto LAB_0098498d;
    *puVar6 = 0;
  }
  pRVar7 = UnsafeVarTo<Js::RecyclableObject>(aValue);
  pTVar1 = (pRVar7->type).ptr;
  switch(pTVar1->typeId) {
  case TypeIds_Undefined:
  case TypeIds_Null:
    bVar3 = false;
    break;
  default:
    BVar4 = JavascriptOperators::IsObject(aValue);
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                  ,0x316,"(JavascriptOperators::IsObject(aValue))",
                                  "bad type object in conversion ToBoolean");
      if (!bVar3) {
LAB_0098498d:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    bVar3 = (pTVar1->flags & TypeFlagMask_IsFalsy) == TypeFlagMask_None;
    break;
  case TypeIds_Int64Number:
    pJVar8 = (JavascriptTypedNumber<unsigned_long> *)
             UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aValue);
    goto LAB_00984969;
  case TypeIds_LastNumberType:
    pJVar8 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aValue);
LAB_00984969:
    bVar3 = pJVar8->m_value == 0;
LAB_00984982:
    bVar3 = !bVar3;
    break;
  case TypeIds_String:
    this = UnsafeVarTo<Js::JavascriptString>(aValue);
    cVar5 = JavascriptString::GetLength(this);
    bVar3 = cVar5 == 0;
    goto LAB_00984982;
  case TypeIds_Symbol:
    bVar3 = true;
  }
  return (BOOL)bVar3;
}

Assistant:

BOOL JavascriptConversion::ToBoolean_Full(Var aValue, ScriptContext* scriptContext)
    {
        AssertMsg(!TaggedInt::Is(aValue), "Should be detected");
        AssertMsg(VarIs<RecyclableObject>(aValue), "Should be handled already");

        auto type = UnsafeVarTo<RecyclableObject>(aValue)->GetType();

        switch (type->GetTypeId())
        {
        case TypeIds_Undefined:
        case TypeIds_Null:
            return false;

        case TypeIds_Symbol:
            return true;

#if !FLOATVAR
        case TypeIds_Number:
            {
                double value = JavascriptNumber::GetValue(aValue);
                return (!JavascriptNumber::IsNan(value)) && (!JavascriptNumber::IsZero(value));
            }
#endif

        case TypeIds_Int64Number:
            {
                __int64 value = UnsafeVarTo<JavascriptInt64Number>(aValue)->GetValue();
                return value != 0;
            }

        case TypeIds_UInt64Number:
            {
                unsigned __int64 value = UnsafeVarTo<JavascriptUInt64Number>(aValue)->GetValue();
                return value != 0;
            }

        case TypeIds_String:
            {
                JavascriptString * pstValue = UnsafeVarTo<JavascriptString>(aValue);
                return pstValue->GetLength() > 0;
            }

        default:
            {
                AssertMsg(JavascriptOperators::IsObject(aValue), "bad type object in conversion ToBoolean");

                // Falsy objects evaluate to false when converted to Boolean.
                return !type->IsFalsy();
            }
        }
    }